

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface_test.cc
# Opt level: O3

void __thiscall anon_unknown.dwarf_102615::StatTestMiddle::~StatTestMiddle(StatTestMiddle *this)

{
  StatTest::~StatTest(&this->super_StatTest);
  operator_delete(this,0x1b0);
  return;
}

Assistant:

TEST_F(StatTest, Middle) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build out: cat mid\n"
"build mid: cat in\n"));

  mtimes_["in"] = 1;
  mtimes_["mid"] = 0;  // missing
  mtimes_["out"] = 1;

  Node* out = GetNode("out");
  string err;
  EXPECT_TRUE(out->Stat(this, &err));
  EXPECT_EQ("", err);
  ASSERT_EQ(1u, stats_.size());
  scan_.RecomputeDirty(out, NULL, NULL);
  ASSERT_FALSE(GetNode("in")->dirty());
  ASSERT_TRUE(GetNode("mid")->dirty());
  ASSERT_TRUE(GetNode("out")->dirty());
}